

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraphFlattener::convertMultiLevelInstances
          (SceneGraphFlattener *this,Ref<embree::SceneGraph::Node> *node)

{
  _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
  *this_00;
  Node *pNVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  GroupNode *this_01;
  key_type *in_RDX;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  group;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  local_38;
  
  this_00 = (_Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             *)(node + 1);
  iVar2 = std::
          _Rb_tree<embree::Ref<embree::SceneGraph::Node>,_std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>,_std::_Select1st<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
          ::find(this_00,in_RDX);
  if (iVar2._M_node == (_Base_ptr)(node + 2)) {
    local_38.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    convertMultiLevelInstances((SceneGraphFlattener *)node,&local_38,in_RDX);
    this_01 = (GroupNode *)::operator_new(0x80);
    SceneGraph::GroupNode::GroupNode(this_01,&local_38);
    pmVar3 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)this_00,in_RDX);
    (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
    if (pmVar3->ptr != (Node *)0x0) {
      (*(pmVar3->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pmVar3->ptr = (Node *)this_01;
    (this->node).ptr = (Node *)this_01;
    (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
    std::
    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
    ::~vector(&local_38);
  }
  else {
    pmVar3 = std::
             map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
             ::operator[]((map<embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>,_std::less<embree::Ref<embree::SceneGraph::Node>_>,_std::allocator<std::pair<const_embree::Ref<embree::SceneGraph::Node>,_embree::Ref<embree::SceneGraph::Node>_>_>_>
                           *)this_00,in_RDX);
    pNVar1 = pmVar3->ptr;
    (this->node).ptr = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      (*(pNVar1->super_RefCount)._vptr_RefCount[2])();
    }
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> convertMultiLevelInstances(const Ref<SceneGraph::Node>& node)
    {
      if (object_mapping.find(node) != object_mapping.end()) {
        return object_mapping[node];
      }
      
      std::vector<Ref<SceneGraph::Node>> group;
      convertMultiLevelInstances(group,node);
      auto new_node = new SceneGraph::GroupNode(group);
      object_mapping[node] = new_node;
      return new_node;
    }